

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3e00dc::AVxFirstPassEncoderThreadTest::~AVxFirstPassEncoderThreadTest
          (AVxFirstPassEncoderThreadTest *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__AVxFirstPassEncoderThreadTest_01f4d718;
  in_RDI[2] = &PTR__AVxFirstPassEncoderThreadTest_01f4d780;
  in_RDI[3] = &PTR__AVxFirstPassEncoderThreadTest_01f4d7a0;
  free((void *)in_RDI[0x82]);
  libaom_test::EncoderTest::~EncoderTest((EncoderTest *)0x52eb0c);
  libaom_test::CodecTestWith4Params<libaom_test::TestMode,_int,_int,_int>::~CodecTestWith4Params
            ((CodecTestWith4Params<libaom_test::TestMode,_int,_int,_int> *)0x52eb16);
  return;
}

Assistant:

~AVxFirstPassEncoderThreadTest() override { free(firstpass_stats_.buf); }